

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressEnd_public
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  unsigned_long_long uVar2;
  size_t sVar3;
  size_t sVar4;
  XXH64_hash_t XVar5;
  size_t err_code_1;
  undefined4 *puVar6;
  undefined4 *dst_00;
  ulong uVar7;
  size_t err_code;
  size_t err_code_2;
  
  sVar3 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar3) {
    return sVar3;
  }
  ZVar1 = cctx->stage;
  if (ZVar1 == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  dst_00 = (undefined4 *)((long)dst + sVar3);
  uVar7 = dstCapacity - sVar3;
  puVar6 = dst_00;
  if (ZVar1 != ZSTDcs_ending) {
    if (ZVar1 == ZSTDcs_init) {
      sVar4 = ZSTD_writeFrameHeader(dst_00,uVar7,&cctx->appliedParams,0,0);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      uVar7 = uVar7 - sVar4;
      cctx->stage = ZSTDcs_ongoing;
      puVar6 = (undefined4 *)(sVar4 + (long)dst_00);
    }
    if (uVar7 < 4) {
      return 0xffffffffffffffba;
    }
    *puVar6 = 1;
    uVar7 = uVar7 - 3;
    puVar6 = (undefined4 *)((long)puVar6 + 3);
  }
  if ((cctx->appliedParams).fParams.checksumFlag != 0) {
    XVar5 = XXH_INLINE_XXH64_digest(&cctx->xxhState);
    if (uVar7 < 4) {
      return 0xffffffffffffffba;
    }
    *puVar6 = (int)XVar5;
    puVar6 = puVar6 + 1;
  }
  cctx->stage = ZSTDcs_created;
  uVar7 = (long)puVar6 - (long)dst_00;
  if (0xffffffffffffff88 < uVar7) {
    return uVar7;
  }
  uVar2 = cctx->pledgedSrcSizePlusOne;
  if ((cctx->appliedParams).fParams.contentSizeFlag == 0) {
    if (uVar2 == 0) goto LAB_001948e9;
  }
  else if (uVar2 == 0) {
    __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x64f5,
                  "size_t ZSTD_compressEnd_public(ZSTD_CCtx *, void *, size_t, const void *, size_t)"
                 );
  }
  if (uVar2 != cctx->consumedSrcSize + 1) {
    return 0xffffffffffffffb8;
  }
LAB_001948e9:
  return uVar7 + sVar3;
}

Assistant:

size_t ZSTD_compressEnd_public(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}